

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_allocator.hpp
# Opt level: O2

JsonValue * __thiscall
MercuryJson::BlockAllocator<MercuryJson::JsonValue>::
construct<MercuryJson::JsonValue,MercuryJson::JsonObject*>
          (BlockAllocator<MercuryJson::JsonValue> *this,JsonObject *args)

{
  JsonValue *pJVar1;
  
  check_alloc(this,0x10);
  pJVar1 = (JsonValue *)this->ptr;
  pJVar1->type = TYPE_OBJ;
  (pJVar1->field_1).object = args;
  this->ptr = this->ptr + 0x10;
  this->allocated = this->allocated + 0x10;
  return pJVar1;
}

Assistant:

T *construct(Args ...args) {
            check_alloc(sizeof(T));
            static constexpr size_t size = round_up(sizeof(T), kAlignment);
            T *ret = new(ptr) T(std::forward<Args>(args)...);
            ptr += size;
            allocated += size;
            return ret;
        }